

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::Expect(Parser *this,int t)

{
  int in_EDX;
  int t_00;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  Parser *pPStack_10;
  int t_local;
  Parser *this_local;
  
  local_14 = t;
  pPStack_10 = this;
  if (t != this->token_) {
    TokenToString_abi_cxx11_(&local_98,(flatbuffers *)(ulong)(uint)t,in_EDX);
    std::operator+(&local_78,"expecting: ",&local_98);
    std::operator+(&local_58,&local_78," instead got: ");
    TokenToString_abi_cxx11_(&local_c8,(flatbuffers *)(ulong)(uint)this->token_,t_00);
    std::operator+(&local_38,&local_58,&local_c8);
    Error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  Next(this);
  return;
}

Assistant:

void Parser::Expect(int t) {
  if (t != token_) {
    Error("expecting: " + TokenToString(t) + " instead got: " +
          TokenToString(token_));
  }
  Next();
}